

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.h
# Opt level: O1

void __thiscall Minisat::Solver::simplifyLearnt<Minisat::Clause>(Solver *this,Clause *c)

{
  vec<Minisat::Lit> *this_00;
  uint64_t *puVar1;
  byte bVar2;
  undefined4 uVar3;
  lbool *plVar4;
  VarData *pVVar5;
  anon_struct_8_10_eb538618_for_header aVar6;
  Lit *pLVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  CRef confl;
  uint uVar11;
  ulong uVar12;
  uint64_t uVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  int local_64;
  vec<unsigned_int> *local_60;
  ulong local_58;
  ulong local_50;
  Clause *local_48;
  anon_struct_8_10_eb538618_for_header local_40;
  vec<int> *local_38;
  
  this->original_length_record = this->original_length_record + ((ulong)c->header >> 0x22);
  this->trailRecord = (this->trail).sz;
  local_58 = (ulong)c->header >> 0x22;
  this->LCM_total_tries = this->LCM_total_tries + 1;
  local_38 = &this->trail_lim;
  this_00 = &this->simp_learnt_clause;
  local_60 = &this->simp_reason_clause;
  local_48 = c + 1;
  bVar10 = false;
  local_40 = (anon_struct_8_10_eb538618_for_header)0x400000000;
  local_50 = 0;
  bVar9 = false;
  do {
    puVar1 = &(this->statistics).solveSteps;
    *puVar1 = *puVar1 + 1;
    if (bVar9) {
      uVar12 = (ulong)c->header >> 0x22;
      if (uVar12 == 1) {
LAB_0011d652:
        if ((bVar10) && (0x7ffffffff < (ulong)c->header)) {
          lVar15 = 0;
          lVar16 = ((ulong)c->header >> 0x22) - 2;
          do {
            uVar3 = *(undefined4 *)(&c[1].header.field_0x0 + lVar15 * 4);
            *(undefined4 *)(&c[1].header.field_0x0 + lVar15 * 4) =
                 *(undefined4 *)(&c[1].header.field_0x4 + lVar16 * 4);
            *(undefined4 *)(&c[1].header.field_0x4 + lVar16 * 4) = uVar3;
            lVar15 = lVar15 + 1;
            bVar9 = lVar15 < lVar16;
            lVar16 = lVar16 + -1;
          } while (bVar9);
        }
        this->LCM_successful_tries =
             this->LCM_successful_tries + (ulong)((uint)local_58 != SUB84(c->header,4) >> 2);
        return;
      }
      if (0x7ffffffff < (ulong)c->header) {
        lVar15 = 0;
        lVar16 = uVar12 - 2;
        do {
          uVar3 = *(undefined4 *)(&c[1].header.field_0x0 + lVar15 * 4);
          *(undefined4 *)(&c[1].header.field_0x0 + lVar15 * 4) =
               *(undefined4 *)(&c[1].header.field_0x4 + lVar16 * 4);
          *(undefined4 *)(&c[1].header.field_0x4 + lVar16 * 4) = uVar3;
          lVar15 = lVar15 + 1;
          bVar8 = lVar15 < lVar16;
          lVar16 = lVar16 + -1;
        } while (bVar8);
      }
      bVar10 = (bool)(bVar10 ^ 1);
      local_50 = (ulong)c->header >> 0x22;
    }
    local_64 = (this->trail).sz;
    vec<int>::push(local_38,&local_64);
    iVar17 = 0;
    if ((ulong)local_40 <= (ulong)c->header) {
      uVar12 = 0;
      iVar17 = 0;
      do {
        uVar11 = *(uint *)(&c[1].header.field_0x0 + uVar12 * 4);
        iVar14 = (int)uVar11 >> 1;
        plVar4 = (this->assigns).data;
        bVar2 = plVar4[iVar14].value;
        if ((bVar2 & 2) == 0) {
          if (bVar2 == ((byte)uVar11 & 1)) {
            lVar16 = (long)iVar17;
            iVar17 = iVar17 + 1;
            *(uint *)(&c[1].header.field_0x0 + lVar16 * 4) = uVar11;
            bVar8 = true;
            confl = (this->vardata).data[*(int *)(&c[1].header.field_0x0 + uVar12 * 4) >> 1].reason;
            goto LAB_0011d456;
          }
        }
        else {
          plVar4[iVar14].value = (byte)(uVar11 ^ 1) & 1;
          pVVar5 = (this->vardata).data;
          pVVar5[iVar14].reason = 0xffffffff;
          pVVar5[iVar14].level = (this->trail_lim).sz;
          iVar14 = (this->trail).sz;
          (this->trail).sz = iVar14 + 1;
          (this->trail).data[iVar14].x = uVar11 ^ 1;
          lVar16 = (long)iVar17;
          iVar17 = iVar17 + 1;
          *(undefined4 *)(&c[1].header.field_0x0 + lVar16 * 4) =
               *(undefined4 *)(&c[1].header.field_0x0 + uVar12 * 4);
          confl = simplePropagate(this);
          if (confl != 0xffffffff) {
            bVar8 = false;
            goto LAB_0011d456;
          }
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 < (ulong)c->header >> 0x22);
    }
    bVar8 = false;
    confl = 0xffffffff;
LAB_0011d456:
    aVar6 = c->header;
    if (((ulong)aVar6 & 8) != 0) {
      *(undefined4 *)(&c[1].header.field_0x0 + (long)iVar17 * 4) =
           *(undefined4 *)(&c[1].header.field_0x0 + ((ulong)aVar6 >> 0x22) * 4);
    }
    c->header = (anon_struct_8_10_eb538618_for_header)
                ((ulong)c->header & 0x3ffffffff |
                (ulong)((SUB84(c->header,4) >> 2) + (iVar17 - (aVar6._4_4_ >> 2))) << 0x22);
    if (!(bool)(confl == 0xffffffff & (bVar8 ^ 1U))) {
      if (this_00->data != (Lit *)0x0) {
        (this->simp_learnt_clause).sz = 0;
      }
      if (local_60->data != (uint *)0x0) {
        (this->simp_reason_clause).sz = 0;
      }
      if (bVar8 != false) {
        vec<Minisat::Lit>::push
                  (this_00,(Lit *)((long)local_48 + ((ulong)c->header >> 0x22) * 4 + -4));
      }
      simpleAnalyze(this,confl,this_00,local_60,bVar8);
      aVar6 = c->header;
      uVar11 = aVar6._4_4_ >> 2;
      if ((this->simp_learnt_clause).sz < (int)uVar11) {
        if ((this->simp_learnt_clause).sz < 1) {
          uVar12 = 0;
        }
        else {
          pLVar7 = this_00->data;
          uVar12 = 0;
          do {
            *(int *)(&c[1].header.field_0x0 + uVar12 * 4) = pLVar7[uVar12].x;
            uVar12 = uVar12 + 1;
          } while ((long)uVar12 < (long)(this->simp_learnt_clause).sz);
        }
        if (((ulong)aVar6 & 8) != 0) {
          *(undefined4 *)(&c[1].header.field_0x0 + (uVar12 & 0xffffffff) * 4) =
               *(undefined4 *)(&c[1].header.field_0x0 + ((ulong)aVar6 >> 0x22) * 4);
        }
        c->header = (anon_struct_8_10_eb538618_for_header)
                    ((ulong)c->header & 0x3ffffffff |
                    (ulong)((SUB84(c->header,4) >> 2) + ((int)uVar12 - uVar11)) << 0x22);
      }
    }
    cancelUntil(this,0,false);
    cancelUntilTrailRecord(this);
    this->simplified_length_record = this->simplified_length_record + ((ulong)c->header >> 0x22);
    aVar6 = c->header;
    if (((ulong)aVar6 < 0x800000000) || ((uint)local_58 == aVar6._4_4_ >> 2)) goto LAB_0011d652;
    this->LCM_dropped_lits = this->LCM_dropped_lits + (local_58 - ((ulong)aVar6 >> 0x22));
    if (bVar9) {
      uVar13 = (long)(int)((int)local_50 - (SUB84(c->header,4) >> 2)) + this->LCM_dropped_reverse;
    }
    else {
      uVar13 = this->LCM_dropped_reverse;
    }
    this->LCM_dropped_reverse = uVar13;
    if ((bVar9) || (bVar9 = true, this->reverse_LCM == false)) goto LAB_0011d652;
  } while( true );
}

Assistant:

inline void Solver::simplifyLearnt(C &c)
{
    ////
    original_length_record += c.size();

    trailRecord = trail.size(); // record the start pointer

    bool True_confl = false, reversed = false;
    int beforeSize = c.size(), preReserve = 0;
    int i, j;
    CRef confl = CRef_Undef;

    LCM_total_tries++;

    TRACE(std::cout << "c start simplifying clause " << c << std::endl);

    // try to simplify in reverse order, in case original succeeds
    for (size_t iteration = 0; iteration < (reverse_LCM ? 2 : 1); ++iteration) {
        True_confl = false;
        confl = CRef_Undef;
        statistics.solveSteps++;
        // reorder the current clause for next iteration?
        // (only useful if size changed in first iteration)
        if (iteration > 0) {
            if (c.size() == 1) break;
            c.reverse();
            reversed = !reversed;
            preReserve = c.size();
        }

        assert(decisionLevel() == 0 && "only run simplification on level 0");
        newDecisionLevel();
        assert(decisionLevel() == 1 && "only run simplification on level 0");

        for (i = 0, j = 0; i < c.size(); i++) {
            if (value(c[i]) == l_Undef) {
                // printf("///@@@ uncheckedEnqueue:index = %d. l_Undef\n", i);
                simpleUncheckEnqueue(~c[i]);
                c[j++] = c[i];
                confl = simplePropagate();
                if (confl != CRef_Undef) {
                    break;
                }
            } else {
                if (value(c[i]) == l_True) {
                    // printf("///@@@ uncheckedEnqueue:index = %d. l_True\n", i);
                    c[j++] = c[i];
                    True_confl = true;
                    confl = reason(var(c[i]));
                    break;
                } else {
                    // printf("///@@@ uncheckedEnqueue:index = %d. l_False\n", i);
                }
            }
        }
        TRACE(if (c.size() - j > 0) {
            std::cout << "c shrink clause after propagation to " << c << " (dropping last " << c.size() - j
                      << " literals, reverse=" << reversed << ")" << std::endl;
        });
        c.shrink(c.size() - j);

        if (confl != CRef_Undef || True_confl == true) {
            simp_learnt_clause.clear();
            simp_reason_clause.clear();
            if (True_confl == true) {
                simp_learnt_clause.push(c.last());
            }
            simpleAnalyze(confl, simp_learnt_clause, simp_reason_clause, True_confl);

            if (simp_learnt_clause.size() < c.size()) {
                for (i = 0; i < simp_learnt_clause.size(); i++) {
                    c[i] = simp_learnt_clause[i];
                }
                TRACE(if (c.size() - i > 0) {
                    std::cout << "c shrink clause after analysis to " << c << " (dropping last " << c.size() - i
                              << " literals, reverse=" << reversed << ")" << std::endl;
                });
                c.shrink(c.size() - i);
            }
        }

        assert(decisionLevel() == 1);
        cancelUntil(0);
        cancelUntilTrailRecord();
        assert(decisionLevel() == 0);

        ////
        simplified_length_record += c.size();

        // printf("\nbefore : %d, after : %d ", beforeSize, afterSize);
        if (beforeSize == c.size() || c.size() <= 1) break;
        TRACE(std::cout << "c simplified clause to " << c << " (before size: " << beforeSize << ")" << std::endl);
        LCM_dropped_lits += (beforeSize - c.size());
        LCM_dropped_reverse = iteration == 0 ? LCM_dropped_reverse : LCM_dropped_reverse + (preReserve - c.size());
    }

    // make sure the original order is restored, in case we resorted
    if (reversed) c.reverse();

    LCM_successful_tries = beforeSize == c.size() ? LCM_successful_tries : LCM_successful_tries + 1;
}